

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_lib.c
# Opt level: O0

int BIO_get_line(BIO *bio,char *buf,int size)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *data;
  int in_EDX;
  char *in_RSI;
  BIO *in_RDI;
  char *ptr;
  int ret;
  int local_38;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  char *pcVar4;
  int local_4;
  
  local_38 = 0;
  if (in_RSI == (char *)0x0) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_EDX,local_38),(int)((ulong)in_RSI >> 0x20),
                  (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    ERR_set_error(0x20,0xc0102,(char *)0x0);
    local_4 = -1;
  }
  else if (in_EDX < 1) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_EDX,local_38),(int)((ulong)in_RSI >> 0x20),
                  (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    ERR_set_error(0x20,0x7d,(char *)0x0);
    local_4 = -1;
  }
  else {
    *in_RSI = '\0';
    if (in_RDI == (BIO *)0x0) {
      ERR_new();
      ERR_set_debug((char *)CONCAT44(in_EDX,local_38),(int)((ulong)in_RSI >> 0x20),
                    (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      ERR_set_error(0x20,0xc0102,(char *)0x0);
      local_4 = -1;
    }
    else {
      data = in_RSI;
      if (in_RDI->num == 0) {
        ERR_new();
        ERR_set_debug((char *)CONCAT44(in_EDX,local_38),(int)((ulong)in_RSI >> 0x20),
                      (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
        ERR_set_error(0x20,0x78,(char *)0x0);
        local_4 = -1;
      }
      else {
        do {
          iVar2 = in_EDX + -1;
          bVar1 = false;
          pcVar4 = data;
          if (1 < in_EDX) {
            local_38 = BIO_read(in_RDI,data,1);
            bVar1 = 0 < local_38;
            pcVar4 = data;
          }
          data = pcVar4;
        } while ((bVar1) && (data = pcVar4 + 1, in_EDX = iVar2, *pcVar4 != '\n'));
        *data = '\0';
        if ((0 < local_38) || (lVar3 = BIO_ctrl(in_RDI,2,0,(void *)0x0), (int)lVar3 != 0)) {
          local_38 = (int)data - (int)in_RSI;
        }
        local_4 = local_38;
      }
    }
  }
  return local_4;
}

Assistant:

int BIO_get_line(BIO *bio, char *buf, int size)
{
    int ret = 0;
    char *ptr = buf;

    if (buf == NULL) {
        ERR_raise(ERR_LIB_BIO, ERR_R_PASSED_NULL_PARAMETER);
        return -1;
    }
    if (size <= 0) {
        ERR_raise(ERR_LIB_BIO, BIO_R_INVALID_ARGUMENT);
        return -1;
    }
    *buf = '\0';

    if (bio == NULL) {
        ERR_raise(ERR_LIB_BIO, ERR_R_PASSED_NULL_PARAMETER);
        return -1;
    }
    if (!bio->init) {
        ERR_raise(ERR_LIB_BIO, BIO_R_UNINITIALIZED);
        return -1;
    }

    while (size-- > 1 && (ret = BIO_read(bio, ptr, 1)) > 0)
        if (*ptr++ == '\n')
            break;
    *ptr = '\0';
    return ret > 0 || BIO_eof(bio) ? ptr - buf : ret;
}